

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_avx2.c
# Opt level: O0

void av1_nn_predict_avx2(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  float *pfVar5;
  __m128 *in_RCX;
  long lVar6;
  int in_EDX;
  int *in_RSI;
  __m128 *in_RDI;
  bool bVar7;
  __m128 weight;
  __m128 input;
  int in_node;
  __m128 outputs_2;
  int out_3;
  int in_2;
  __m128 outputs_1;
  int out_2;
  int in_1;
  __m128 outputs;
  int out_1;
  __m128 zero;
  int in;
  __m128 out_l;
  __m128 out_h;
  int out;
  int input_remaining;
  float *out_temp;
  int bias_is_considered;
  int num_inputs_to_process;
  int in_mul_8;
  int num_outputs;
  float *output_nodes;
  _Bool is_output_layer;
  float *layer_bias;
  float *layer_weights;
  int layer;
  int num_inputs;
  int buf_index;
  float buf [2] [128];
  int in_stack_fffffffffffff85c;
  __m128 *in_stack_fffffffffffff860;
  _Bool is_output_layer_00;
  int in_stack_fffffffffffff868;
  int num_inputs_to_process_00;
  __m128 *bias;
  float *in_stack_fffffffffffff878;
  float *in_stack_fffffffffffff880;
  __m128 *in_stack_fffffffffffff888;
  __m128 *in_stack_fffffffffffff890;
  float *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a4;
  undefined1 local_758 [8];
  undefined8 uStack_750;
  int local_740;
  int local_73c;
  undefined1 local_738 [24];
  int local_720;
  int local_71c;
  undefined1 local_718 [16];
  int local_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  int local_6dc;
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  int local_6b8;
  int local_6b4;
  __m128 *local_6b0;
  uint local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  __m128 *local_698;
  byte local_689;
  __m128 *local_688;
  long local_680;
  int local_674;
  int local_670;
  int local_66c;
  float local_668 [258];
  __m128 *local_260;
  int local_254;
  int *local_250;
  __m128 *local_248;
  float *local_240;
  float *local_238;
  float *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8 [2];
  float afStack_1b0 [2];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  float *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float *local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d4;
  float *local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b4;
  float *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_94;
  float *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_74;
  float *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58 [2];
  float afStack_50 [2];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  float *local_28;
  float *pfStack_20;
  __m128 *local_18;
  __m128 *pafStack_10;
  
  local_66c = 0;
  local_670 = *in_RSI;
  local_260 = in_RCX;
  local_254 = in_EDX;
  local_250 = in_RSI;
  local_248 = in_RDI;
  for (local_674 = 0; local_674 <= local_250[2]; local_674 = local_674 + 1) {
    local_680 = *(long *)(local_250 + (long)local_674 * 2 + 0xe);
    local_688 = *(__m128 **)(local_250 + (long)local_674 * 2 + 0x24);
    local_689 = local_674 == local_250[2];
    if ((bool)local_689) {
      num_inputs_to_process_00 = local_250[1];
      bias = local_260;
    }
    else {
      bias = (__m128 *)(local_668 + (long)local_66c * 0x80);
      num_inputs_to_process_00 = local_250[(long)local_674 + 3];
    }
    is_output_layer_00 = SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0);
    local_69c = num_inputs_to_process_00;
    local_698 = bias;
    if (local_670 % 8 == 0) {
      nn_propagate_input_multiple_of_8
                (in_stack_fffffffffffff880,in_stack_fffffffffffff878,*bias,num_inputs_to_process_00,
                 in_stack_fffffffffffff868,is_output_layer_00,(int)in_stack_fffffffffffff890,
                 in_stack_fffffffffffff898);
    }
    else {
      local_6a0 = local_670 / 8;
      local_6a4 = local_6a0 << 3;
      local_6a8 = 0;
      bVar7 = local_6a0 != 0;
      if (bVar7) {
        nn_propagate_input_multiple_of_8
                  (in_stack_fffffffffffff880,in_stack_fffffffffffff878,*bias,
                   num_inputs_to_process_00,in_stack_fffffffffffff868,is_output_layer_00,
                   (int)in_stack_fffffffffffff890,in_stack_fffffffffffff898);
      }
      local_6a8 = (uint)bVar7;
      in_stack_fffffffffffff860 = local_688;
      if (local_6a8 != 0) {
        in_stack_fffffffffffff860 = local_698;
      }
      local_6b4 = local_670 % 8;
      local_6b0 = in_stack_fffffffffffff860;
      if ((local_6b4 % 4 == 0) && (local_69c % 8 == 0)) {
        for (local_6b8 = 0; local_6b8 < local_69c; local_6b8 = local_6b8 + 8) {
          local_230 = *local_6b0 + (local_6b8 + 4);
          local_6c8 = *(undefined1 (*) [16])local_230;
          local_238 = *local_6b0 + local_6b8;
          local_6d8 = *(undefined1 (*) [16])local_238;
          for (local_6dc = local_6a0 << 3; local_6dc < local_670; local_6dc = local_6dc + 4) {
            av1_nn_propagate_4to8_sse3
                      ((float *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                       in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888
                       ,(int)((ulong)in_stack_fffffffffffff880 >> 0x20));
          }
          if ((local_689 & 1) == 0) {
            local_1f8 = 0;
            uStack_1f0 = 0;
            local_6f8 = 0;
            uStack_6f0 = 0;
            local_158 = local_6c8._0_8_;
            uStack_150 = local_6c8._8_8_;
            local_168 = 0;
            uStack_160 = 0;
            local_6c8 = vmaxps_avx(local_6c8,ZEXT816(0));
            local_178 = local_6d8._0_8_;
            uStack_170 = local_6d8._8_8_;
            local_188 = 0;
            uStack_180 = 0;
            local_6d8 = vmaxps_avx(local_6d8,ZEXT816(0));
          }
          pfVar5 = *local_698 + (local_6b8 + 4);
          local_108 = local_6c8._0_8_;
          uStack_100 = local_6c8._8_8_;
          local_f0 = pfVar5;
          *(undefined8 *)pfVar5 = local_6c8._0_8_;
          *(undefined8 *)(pfVar5 + 2) = local_6c8._8_8_;
          local_110 = *local_698 + local_6b8;
          local_128 = local_6d8._0_8_;
          uStack_120 = local_6d8._8_8_;
          *(undefined1 (*) [16])local_110 = local_6d8;
        }
      }
      else if ((local_6b4 % 4 == 0) && (local_69c % 4 == 0)) {
        for (local_6fc = 0; local_6fc < local_69c; local_6fc = local_6fc + 4) {
          local_240 = *local_6b0 + local_6fc;
          local_718 = *(undefined1 (*) [16])local_240;
          for (local_71c = local_6a0 << 3; local_71c < local_670; local_71c = local_71c + 4) {
            av1_nn_propagate_4to4_sse3
                      (*bias,(float *)CONCAT44(num_inputs_to_process_00,in_stack_fffffffffffff868),
                       in_stack_fffffffffffff860,in_stack_fffffffffffff85c);
          }
          if ((local_689 & 1) == 0) {
            local_208 = 0;
            uStack_200 = 0;
            local_198 = local_718._0_8_;
            uStack_190 = local_718._8_8_;
            local_1a8 = 0;
            uStack_1a0 = 0;
            local_718 = vmaxps_avx(local_718,ZEXT816(0));
          }
          local_130 = *local_698 + local_6fc;
          local_148 = local_718._0_8_;
          uStack_140 = local_718._8_8_;
          *(undefined1 (*) [16])local_130 = local_718;
        }
      }
      else if (local_6b4 % 4 == 0) {
        for (local_720 = 0; local_720 < local_69c; local_720 = local_720 + 1) {
          local_70 = *local_6b0 + local_720;
          local_88 = *local_70;
          local_738._4_4_ = local_88;
          local_738._0_4_ = local_88;
          local_738._12_4_ = local_88;
          local_738._8_4_ = local_88;
          fStack_84 = local_88;
          fStack_80 = local_88;
          fStack_7c = local_88;
          local_74 = local_88;
          for (local_73c = local_6a0 << 3; auVar2 = local_738._0_16_, local_73c < local_670;
              local_73c = local_73c + 4) {
            av1_nn_propagate_4to1_sse3
                      (*local_248 + local_73c,
                       (float *)(local_680 + (long)(local_720 * local_670 + local_73c) * 4),
                       (__m128 *)local_738);
          }
          if ((local_689 & 1) == 0) {
            local_218 = 0;
            uStack_210 = 0;
            local_1b8[0] = (float)local_738._0_4_;
            local_1b8[1] = (float)local_738._4_4_;
            afStack_1b0[0] = (float)local_738._8_4_;
            afStack_1b0[1] = (float)local_738._12_4_;
            local_1c8 = 0;
            uStack_1c0 = 0;
            local_738._0_16_ = vmaxps_avx(auVar2,ZEXT816(0));
          }
          auVar2 = local_738._0_16_;
          uVar3._0_4_ = (float)local_738._0_4_;
          uVar3._4_4_ = (float)local_738._4_4_;
          local_738._8_8_ = auVar2._8_8_;
          uVar4._0_4_ = (float)local_738._8_4_;
          uVar4._4_4_ = (float)local_738._12_4_;
          local_58[0] = auVar2._0_4_;
          (*local_698)[local_720] = local_58[0];
          local_738._0_16_ = auVar2;
          local_58 = (float  [2])uVar3;
          afStack_50 = (float  [2])uVar4;
        }
      }
      else {
        for (local_740 = 0; local_740 < local_69c; local_740 = local_740 + 1) {
          lVar6 = (long)local_740;
          fVar1 = (*in_stack_fffffffffffff860)[lVar6];
          local_758._4_4_ = fVar1;
          local_758._0_4_ = fVar1;
          uStack_750._4_4_ = fVar1;
          uStack_750._0_4_ = fVar1;
          for (in_stack_fffffffffffff8a4 = local_6a0 << 3; in_stack_fffffffffffff8a4 < local_670;
              in_stack_fffffffffffff8a4 = in_stack_fffffffffffff8a4 + 1) {
            local_b0 = *local_248 + in_stack_fffffffffffff8a4;
            local_c8 = *local_b0;
            in_stack_fffffffffffff888 = (__m128 *)CONCAT44(local_c8,local_c8);
            in_stack_fffffffffffff890 = (__m128 *)CONCAT44(local_c8,local_c8);
            local_d0 = (float *)(local_680 +
                                (long)(local_670 * local_740 + in_stack_fffffffffffff8a4) * 4);
            local_e8 = *local_d0;
            in_stack_fffffffffffff878 = (float *)CONCAT44(local_e8,local_e8);
            in_stack_fffffffffffff880 = (float *)CONCAT44(local_e8,local_e8);
            auVar2 = _local_758;
            local_48 = local_c8 * local_e8;
            fStack_44 = local_c8 * local_e8;
            fStack_40 = local_c8 * local_e8;
            fStack_3c = local_c8 * local_e8;
            local_38._0_4_ = local_758._0_4_;
            local_38._4_4_ = local_758._4_4_;
            fStack_30 = local_758._8_4_;
            fStack_2c = local_758._12_4_;
            local_758._4_4_ = (float)local_38._4_4_ + fStack_44;
            local_758._0_4_ = (float)local_38._0_4_ + local_48;
            uStack_750._0_4_ = fStack_30 + fStack_40;
            uStack_750._4_4_ = fStack_2c + fStack_3c;
            fStack_e4 = local_e8;
            fStack_e0 = local_e8;
            fStack_dc = local_e8;
            local_d4 = local_e8;
            fStack_c4 = local_c8;
            fStack_c0 = local_c8;
            fStack_bc = local_c8;
            local_b4 = local_c8;
            _local_38 = auVar2;
            local_28 = in_stack_fffffffffffff878;
            pfStack_20 = in_stack_fffffffffffff880;
            local_18 = in_stack_fffffffffffff888;
            pafStack_10 = in_stack_fffffffffffff890;
          }
          if ((local_689 & 1) == 0) {
            local_228 = 0;
            uStack_220 = 0;
            local_1d8 = local_758;
            uStack_1d0 = uStack_750;
            local_1e8 = 0;
            uStack_1e0 = 0;
            _local_758 = vmaxps_avx(_local_758,ZEXT816(0));
          }
          local_68._0_4_ = local_758._0_4_;
          (*local_698)[local_740] = (float)local_68;
          local_a8 = fVar1;
          fStack_a4 = fVar1;
          fStack_a0 = fVar1;
          fStack_9c = fVar1;
          local_94 = fVar1;
          local_90 = *in_stack_fffffffffffff860 + lVar6;
          local_68 = local_758;
          uStack_60 = uStack_750;
        }
      }
    }
    local_248 = local_698;
    local_670 = local_69c;
    local_66c = 1 - local_66c;
  }
  if (local_254 != 0) {
    av1_nn_output_prec_reduce(*local_260,local_250[1]);
  }
  return;
}

Assistant:

void av1_nn_predict_avx2(const float *input_nodes,
                         const NN_CONFIG *const nn_config, int reduce_prec,
                         float *const output) {
  float buf[2][NN_MAX_NODES_PER_LAYER];
  int buf_index = 0;
  int num_inputs = nn_config->num_inputs;
  assert(num_inputs > 0 && num_inputs <= NN_MAX_NODES_PER_LAYER);

  for (int layer = 0; layer <= nn_config->num_hidden_layers; layer++) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    bool is_output_layer = layer == nn_config->num_hidden_layers;
    float *const output_nodes = is_output_layer ? output : &buf[buf_index][0];
    const int num_outputs = is_output_layer
                                ? nn_config->num_outputs
                                : nn_config->num_hidden_nodes[layer];
    assert(num_outputs > 0 && num_outputs <= NN_MAX_NODES_PER_LAYER);

    // Process input multiple of 8 using AVX2 intrinsic.
    if (num_inputs % 8 == 0) {
      nn_propagate_input_multiple_of_8(input_nodes, layer_weights, layer_bias,
                                       num_inputs, num_inputs, is_output_layer,
                                       num_outputs, output_nodes);
    } else {
      // When number of inputs is not multiple of 8, use hybrid approach of AVX2
      // and SSE3 based on the need.
      const int in_mul_8 = num_inputs / 8;
      const int num_inputs_to_process = in_mul_8 * 8;
      int bias_is_considered = 0;
      if (in_mul_8) {
        nn_propagate_input_multiple_of_8(
            input_nodes, layer_weights, layer_bias, num_inputs_to_process,
            num_inputs, is_output_layer, num_outputs, output_nodes);
        bias_is_considered = 1;
      }

      const float *out_temp = bias_is_considered ? output_nodes : layer_bias;
      const int input_remaining = num_inputs % 8;
      if (input_remaining % 4 == 0 && num_outputs % 8 == 0) {
        for (int out = 0; out < num_outputs; out += 8) {
          __m128 out_h = _mm_loadu_ps(&out_temp[out + 4]);
          __m128 out_l = _mm_loadu_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to8_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &out_h, &out_l, num_inputs);
          }
          if (!is_output_layer) {
            const __m128 zero = _mm_setzero_ps();
            out_h = _mm_max_ps(out_h, zero);
            out_l = _mm_max_ps(out_l, zero);
          }
          _mm_storeu_ps(&output_nodes[out + 4], out_h);
          _mm_storeu_ps(&output_nodes[out], out_l);
        }
      } else if (input_remaining % 4 == 0 && num_outputs % 4 == 0) {
        for (int out = 0; out < num_outputs; out += 4) {
          __m128 outputs = _mm_loadu_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to4_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &outputs, num_inputs);
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          _mm_storeu_ps(&output_nodes[out], outputs);
        }
      } else if (input_remaining % 4 == 0) {
        for (int out = 0; out < num_outputs; out++) {
          __m128 outputs = _mm_load1_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to1_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &outputs);
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          output_nodes[out] = _mm_cvtss_f32(outputs);
        }
      } else {
        // Use SSE instructions for scalar operations to avoid the latency
        // of swapping between SIMD and FPU modes.
        for (int out = 0; out < num_outputs; out++) {
          __m128 outputs = _mm_load1_ps(&out_temp[out]);
          for (int in_node = in_mul_8 * 8; in_node < num_inputs; in_node++) {
            __m128 input = _mm_load1_ps(&input_nodes[in_node]);
            __m128 weight =
                _mm_load1_ps(&layer_weights[num_inputs * out + in_node]);
            outputs = _mm_add_ps(outputs, _mm_mul_ps(input, weight));
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          output_nodes[out] = _mm_cvtss_f32(outputs);
        }
      }
    }
    // Before processing the next layer, treat the output of current layer as
    // input to next layer.
    input_nodes = output_nodes;
    num_inputs = num_outputs;
    buf_index = 1 - buf_index;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}